

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O2

bool __thiscall
ON_LocalZero1::BracketSpan(ON_LocalZero1 *this,double s0,double f0,double s1,double f1)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  double *pdVar15;
  uint uVar16;
  uint uVar17;
  double fp;
  double fm;
  double local_60;
  double local_58;
  double local_48;
  double dVar6;
  
  if ((this->m_k != (double *)0x0) && (2 < this->m_k_count)) {
    local_60 = s1;
    local_58 = f1;
    local_48 = f0;
    uVar8 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,s0);
    uVar17 = 0;
    if (0 < (int)uVar8) {
      uVar17 = uVar8;
    }
    uVar9 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,local_60);
    uVar8 = this->m_k_count - 1;
    if (this->m_k_count <= (int)uVar9) {
      uVar9 = uVar8;
    }
    uVar10 = (ulong)uVar9;
    pdVar11 = this->m_k;
    uVar16 = 0xffffffff;
    if ((int)uVar9 < -1) {
      uVar16 = uVar9;
    }
    while (uVar13 = (uint)uVar10, uVar9 = uVar16, -1 < (int)uVar13) {
      uVar9 = uVar13;
      if ((pdVar11[uVar10] != local_60) || (NAN(pdVar11[uVar10]) || NAN(local_60))) break;
      uVar10 = (ulong)(uVar13 - 1);
    }
    uVar16 = uVar17 + 1;
    if ((int)(uVar17 + 1) < (int)uVar8) {
      uVar16 = uVar8;
    }
    pdVar15 = pdVar11 + (ulong)uVar17 + 2;
    while (uVar17 = uVar17 + 1, uVar13 = uVar16, (int)uVar17 < (int)uVar8) {
      pdVar2 = pdVar15 + -1;
      dVar5 = *pdVar15;
      dVar6 = *pdVar15;
      pdVar15 = pdVar15 + 1;
      uVar13 = uVar17;
      if ((*pdVar2 != dVar6) || (NAN(*pdVar2) || NAN(dVar5))) break;
    }
    if ((int)uVar13 <= (int)uVar9) {
      (*this->_vptr_ON_LocalZero1[2])(pdVar11[uVar13],this,&fm,0,0xffffffffffffffff);
      (*this->_vptr_ON_LocalZero1[2])(this->m_k[uVar13],this,&fp,0,1);
      if (((local_48 <= 0.0) && (0.0 <= fm)) || ((0.0 <= local_48 && (fm <= 0.0)))) {
        this->m_s1 = this->m_k[uVar13];
        this->m_f1 = fm;
      }
      else {
        if ((0.0 < local_58) || (fp < 0.0)) {
          if (local_58 < 0.0) {
            return false;
          }
          if (0.0 < fp) {
            return false;
          }
        }
        this->m_s0 = this->m_k[uVar13];
        this->m_f0 = fp;
        if ((int)uVar13 < (int)uVar9) {
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[(int)uVar9],this,&fm,0,0xffffffffffffffff);
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[(int)uVar9],this,&fp,0,1);
          if (((0.0 < local_58) || (fp < 0.0)) && ((local_58 < 0.0 || (0.0 < fp)))) {
            if ((fm < 0.0 || 0.0 < local_48) && (local_48 < 0.0 || 0.0 < fm)) {
              return false;
            }
            pdVar11 = this->m_k;
            this->m_s1 = pdVar11[(int)uVar9];
            this->m_f1 = fm;
LAB_0056ff6f:
            do {
              iVar1 = uVar13 + 1;
              if ((int)uVar9 <= iVar1) {
                return (int)uVar9 <= iVar1;
              }
              iVar4 = uVar13 + uVar9;
              uVar17 = iVar4 >> 1;
              lVar14 = (long)(int)uVar17;
              (*this->_vptr_ON_LocalZero1[2])(pdVar11[lVar14],this,&fm,0,0xffffffffffffffff);
              (*this->_vptr_ON_LocalZero1[2])(this->m_k[lVar14],this,&fp,0,1);
              if ((fm < 0.0 || 0.0 < local_48) && (0.0 < fm || local_48 < 0.0)) {
                if ((fp < 0.0 || 0.0 < local_58) && (0.0 < fp || local_58 < 0.0)) {
                  return (int)uVar9 <= iVar1;
                }
                pdVar11 = this->m_k;
                this->m_s0 = pdVar11[lVar14];
                this->m_f0 = fp;
                lVar12 = (long)this->m_k_count + -2;
                uVar13 = (uint)lVar12;
                if ((int)uVar13 < (int)uVar17) {
                  uVar13 = uVar17;
                }
                do {
                  if (lVar12 <= lVar14) goto LAB_0056ff6f;
                  pdVar15 = pdVar11 + lVar14;
                  lVar3 = lVar14 + 1;
                  lVar7 = lVar14 + 1;
                } while ((*pdVar15 == pdVar11[lVar7]) &&
                        (lVar14 = lVar3, !NAN(*pdVar15) && !NAN(pdVar11[lVar7])));
                uVar13 = (int)lVar3 - 1;
                goto LAB_0056ff6f;
              }
              pdVar11 = this->m_k;
              this->m_s1 = pdVar11[lVar14];
              this->m_f1 = fm;
              uVar10 = (ulong)uVar17;
              uVar8 = uVar17 + 1;
              while (uVar9 = iVar4 >> 0x1f & uVar17, 0 < (int)uVar10) {
                lVar14 = uVar10 - 1;
                uVar9 = uVar8 - 1;
                pdVar15 = pdVar11 + uVar10;
                uVar10 = uVar10 - 1;
                if ((pdVar11[lVar14] != *pdVar15) ||
                   (uVar8 = uVar9, NAN(pdVar11[lVar14]) || NAN(*pdVar15))) break;
              }
            } while( true );
          }
          this->m_s0 = this->m_k[(int)uVar9];
          this->m_f0 = fp;
        }
      }
    }
  }
  return true;
}

Assistant:

bool
ON_LocalZero1::BracketSpan( double s0, double f0, double s1, double f1 )
{
  int i0, i1, i;
  double fm, fp;
  bool rc = true;
  if ( m_k && m_k_count >= 3 ) {
    i0 = ON_SearchMonotoneArray(m_k,m_k_count,s0);
    if ( i0 < 0 )
      i0 = 0;
    i1 = ON_SearchMonotoneArray(m_k,m_k_count,s1);
    if ( i1 >= m_k_count )
      i1 = m_k_count-1;
    while ( i1 >= 0 && s1 == m_k[i1] ) {
      i1--;
    }
    i0++;
    while ( i0 < m_k_count-1 && m_k[i0] == m_k[i0+1] )
      i0++;
    if ( i0 <= i1 ) {
      // we have s0 < m_k[i0] <= ... <= m_k[i1] < s1
      Evaluate( m_k[i0], &fm, nullptr,-1 ); // guard against C0 discontinuities
      Evaluate( m_k[i0], &fp, nullptr, 1 );
      if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
        m_s1 = m_k[i0];
        m_f1 = fm;
      }
      else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
        m_s0 = m_k[i0];
        m_f0 = fp;
        if ( i0 < i1 ) {
          Evaluate( m_k[i1], &fm, nullptr, -1 );
          Evaluate( m_k[i1], &fp, nullptr,  1 );
          if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
            m_s0 = m_k[i1];
            m_f0 = fp;
          }
          else if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
            m_s1 = m_k[i1];
            m_f1 = fm;
            // we have s0 = m_k[i0] < m_k[i1] = s1 and a bonafide sign change
            while (i0+1 < i1) {
              // bisect m_k[i0],...,m_k[i1] until we get a sign change between
              // m_k[i],m_k[i+1].  We need to do this in order to make sure
              // we are passing a C2 function to the repeated zero finders.
              i = (i0+i1)>>1;
              Evaluate( m_k[i], &fm, nullptr, -1 );
              Evaluate( m_k[i], &fp, nullptr,  1 );
              if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
                m_s1 = m_k[i];
                m_f1 = fm;
                i1 = i;
                while ( i1>0 && m_k[i1-1]==m_k[i1])
                  i1--;
              }
              else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
                m_s0 = m_k[i];
                m_f0 = fp;
                i0 = i;
                while ( i0 < m_k_count-2 && m_k[i0] == m_k[i0+1] )
                  i0++;
              }
              else {
                // discontinuous sign change across m_k[i]
                rc = false;
                break;
              }
            }
          }
          else {
            // discontinuous sign change across m_k[i1]
            rc = false;
          }
        }
      }
      else {
        // discontinuous sign change across m_k[i0]
        rc = false;
      }
    }
  }
  return rc;
}